

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O1

bool implementations::scheme::SchemeDispatcher<(implementations::scheme::instruction::instruction)5>
     ::dispatch(SchemeFrame *frame,const_iterator it)

{
  pointer __pos;
  cell *value;
  pointer pcVar1;
  pointer pcVar2;
  pointer pcVar3;
  
  __pos = (frame->expressions).
          super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pcVar1 = (frame->expressions).
           super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pcVar2 = (frame->expressions).
           super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (frame->expressions).
  super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (frame->resolved_arguments).
       super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pcVar3 = (frame->resolved_arguments).
           super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (frame->expressions).
  super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (frame->resolved_arguments).
       super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (frame->expressions).
  super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pcVar3;
  (frame->resolved_arguments).
  super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = __pos;
  (frame->resolved_arguments).
  super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = pcVar1;
  (frame->resolved_arguments).
  super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pcVar2;
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  _M_erase_at_end(&frame->resolved_arguments,__pos);
  value = (frame->expressions).
          super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
          ._M_impl.super__Vector_impl_data._M_start;
  (frame->exp_it)._M_current = value;
  SchemeFrame::setExpression(frame,value);
  return false;
}

Assistant:

static bool dispatch(SchemeFrame &frame, cells::const_iterator it) {
		// Update expressions to call list
		frame.expressions.swap(frame.resolved_arguments);
		frame.resolved_arguments.clear();
		frame.exp_it = frame.expressions.cbegin();
		frame.setExpression(*frame.exp_it);
		// Don't move exp_it
		return false;
	}